

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_Get_Kerning(FT_Face face,FT_UInt left_glyph,FT_UInt right_glyph,FT_UInt kern_mode,
                       FT_Vector *akerning)

{
  FT_Driver pFVar1;
  FT_Face_GetKerningFunc p_Var2;
  FT_Size pFVar3;
  FT_Error FVar4;
  FT_Long a_;
  FT_Long a__00;
  ulong uVar5;
  
  if (face == (FT_Face)0x0) {
    return 0x23;
  }
  if (akerning == (FT_Vector *)0x0) {
    FVar4 = 6;
  }
  else {
    pFVar1 = face->driver;
    akerning->x = 0;
    akerning->y = 0;
    p_Var2 = pFVar1->clazz->get_kerning;
    if (p_Var2 != (FT_Face_GetKerningFunc)0x0) {
      FVar4 = (*p_Var2)(face,left_glyph,right_glyph,akerning);
      if (kern_mode == 2) {
        return FVar4;
      }
      if (FVar4 != 0) {
        return FVar4;
      }
      pFVar3 = face->size;
      a_ = FT_MulFix(akerning->x,(pFVar3->metrics).x_scale);
      akerning->x = a_;
      a__00 = FT_MulFix(akerning->y,(pFVar3->metrics).y_scale);
      akerning->y = a__00;
      if (kern_mode != 1) {
        uVar5 = (ulong)(pFVar3->metrics).x_ppem;
        if (uVar5 < 0x19) {
          a_ = FT_MulDiv(a_,uVar5,0x19);
        }
        uVar5 = (ulong)(pFVar3->metrics).y_ppem;
        if (uVar5 < 0x19) {
          a__00 = FT_MulDiv(a__00,uVar5,0x19);
        }
        akerning->x = a_ + 0x20U & 0xffffffffffffffc0;
        akerning->y = a__00 + 0x20U & 0xffffffffffffffc0;
      }
    }
    FVar4 = 0;
  }
  return FVar4;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Kerning( FT_Face     face,
                  FT_UInt     left_glyph,
                  FT_UInt     right_glyph,
                  FT_UInt     kern_mode,
                  FT_Vector  *akerning )
  {
    FT_Error   error = FT_Err_Ok;
    FT_Driver  driver;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !akerning )
      return FT_THROW( Invalid_Argument );

    driver = face->driver;

    akerning->x = 0;
    akerning->y = 0;

    if ( driver->clazz->get_kerning )
    {
      error = driver->clazz->get_kerning( face,
                                          left_glyph,
                                          right_glyph,
                                          akerning );
      if ( !error )
      {
        if ( kern_mode != FT_KERNING_UNSCALED )
        {
          akerning->x = FT_MulFix( akerning->x, face->size->metrics.x_scale );
          akerning->y = FT_MulFix( akerning->y, face->size->metrics.y_scale );

          if ( kern_mode != FT_KERNING_UNFITTED )
          {
            FT_Pos  orig_x = akerning->x;
            FT_Pos  orig_y = akerning->y;


            /* we scale down kerning values for small ppem values */
            /* to avoid that rounding makes them too big.         */
            /* `25' has been determined heuristically.            */
            if ( face->size->metrics.x_ppem < 25 )
              akerning->x = FT_MulDiv( orig_x,
                                       face->size->metrics.x_ppem, 25 );
            if ( face->size->metrics.y_ppem < 25 )
              akerning->y = FT_MulDiv( orig_y,
                                       face->size->metrics.y_ppem, 25 );

            akerning->x = FT_PIX_ROUND( akerning->x );
            akerning->y = FT_PIX_ROUND( akerning->y );

#ifdef FT_DEBUG_LEVEL_TRACE
            {
              FT_Pos  orig_x_rounded = FT_PIX_ROUND( orig_x );
              FT_Pos  orig_y_rounded = FT_PIX_ROUND( orig_y );


              if ( akerning->x != orig_x_rounded ||
                   akerning->y != orig_y_rounded )
                FT_TRACE5(( "FT_Get_Kerning: horizontal kerning"
                            " (%ld, %ld) scaled down to (%ld, %ld) pixels\n",
                            orig_x_rounded / 64, orig_y_rounded / 64,
                            akerning->x / 64, akerning->y / 64 ));
            }
#endif
          }
        }
      }
    }

    return error;
  }